

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

string * __thiscall
runtime::VirtualMachine::byteCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,VirtualMachine *this,ByteCode bc,bool panic)

{
  unsigned_long __val;
  char *__s;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = bc.parameter;
  switch(bc.instruction) {
  case Halt:
    __s = "Halt";
    break;
  case Add:
    __s = "Add";
    break;
  case Subtract:
    __s = "Subtract";
    break;
  case Multiply:
    __s = "Multiply";
    break;
  case Divide:
    __s = "Divide";
    break;
  case Print:
    __s = "Print";
    break;
  case Read:
    __s = "Read";
    break;
  case Jump:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"Jump(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case JumpIfFalse:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"JumpIfFalse(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case LoadIntegerConstant:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"LoadIntegerConstant(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case LoadFloatConstant:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"LoadFloatConstant(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case LoadStringConstant:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"LoadStringConstant(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case LoadUndefinedConstant:
    __s = "LoadUndefinedConstant";
    break;
  case LoadBooleanTrueConstant:
    __s = "LoadBooleanTrueConstant";
    break;
  case LoadBooleanFalseConstant:
    __s = "LoadBooleanFalseConstant";
    break;
  case LoadLocal:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"LoadLocal(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case SetLocal:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"SetLocal(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case Return:
    __s = "Return";
    break;
  case Invoke:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"Invoke(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case NoOp:
    __s = "NoOp";
    break;
  case MakeFn:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"MakeFn(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case MakeObj:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"MakeObj(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    goto LAB_00119524;
  case Less:
    __s = "Less";
    break;
  case LessOrEqual:
    __s = "LessOrEqual";
    break;
  case Greater:
    __s = "Greater";
    break;
  case GreaterOrEqual:
    __s = "GreaterOrEqual";
    break;
  case Not:
    __s = "Not";
    break;
  case Equal:
    __s = "Equal";
    break;
  case NotEqual:
    __s = "NotEqual";
    break;
  case And:
    __s = "And";
    break;
  case Or:
    __s = "Or";
    break;
  case GetType:
    __s = "GetType";
    break;
  case CastToInt:
    __s = "CastToInt";
    break;
  case CastToFloat:
    __s = "CastToFloat";
    break;
  case Length:
    __s = "Length";
    break;
  case ChatAt:
    __s = "ChatAt";
    break;
  case StringAppend:
    __s = "StringAppend";
    break;
  case ObjectGet:
    __s = "ObjectGet";
    break;
  case ObjectSet:
    __s = "ObjectSet";
    break;
  case GetEnv:
    __s = "GetEnv";
    break;
  case LoadClosure:
    std::__cxx11::to_string(&local_58,__val);
    std::operator+(&local_38,"LoadClosure(",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
LAB_00119524:
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    return __return_storage_ptr__;
  case Pop:
    __s = "Pop";
    break;
  default:
    if (panic) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Unkown bytecode instruction encountered",
                 (allocator<char> *)&local_58);
      VirtualMachine::panic(this,&local_38);
    }
    __s = "<UNKNOWN>";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string runtime::VirtualMachine::byteCodeToString(bytecode::ByteCode bc, bool panic) {

  #define PARAM "(" + std::to_string(bc.parameter) + ")"

  switch (bc.instruction) {
    case bytecode::ByteCodeInstruction::Halt: return "Halt";
    case bytecode::ByteCodeInstruction::Add: return "Add";
    case bytecode::ByteCodeInstruction::Subtract: return "Subtract";
    case bytecode::ByteCodeInstruction::Multiply: return "Multiply";
    case bytecode::ByteCodeInstruction::Divide: return "Divide";
    case bytecode::ByteCodeInstruction::Print: return "Print";
    case bytecode::ByteCodeInstruction::Read: return "Read";
    case bytecode::ByteCodeInstruction::Jump: return "Jump" PARAM;
    case bytecode::ByteCodeInstruction::JumpIfFalse: return "JumpIfFalse" PARAM;
    case bytecode::ByteCodeInstruction::LoadIntegerConstant: return "LoadIntegerConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadFloatConstant: return "LoadFloatConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadStringConstant: return "LoadStringConstant" PARAM;
    case bytecode::ByteCodeInstruction::LoadUndefinedConstant: return "LoadUndefinedConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanTrueConstant: return "LoadBooleanTrueConstant";
    case bytecode::ByteCodeInstruction::LoadBooleanFalseConstant: return "LoadBooleanFalseConstant";
    case bytecode::ByteCodeInstruction::LoadLocal: return "LoadLocal" PARAM;
    case bytecode::ByteCodeInstruction::SetLocal: return "SetLocal" PARAM;
    case bytecode::ByteCodeInstruction::Return: return "Return";
    case bytecode::ByteCodeInstruction::Invoke: return "Invoke" PARAM;
    case bytecode::ByteCodeInstruction::NoOp: return "NoOp";
    case bytecode::ByteCodeInstruction::MakeFn: return "MakeFn" PARAM;
    case bytecode::ByteCodeInstruction::MakeObj: return "MakeObj" PARAM;
    case bytecode::ByteCodeInstruction::Less: return "Less";
    case bytecode::ByteCodeInstruction::LessOrEqual: return "LessOrEqual";
    case bytecode::ByteCodeInstruction::Greater: return "Greater";
    case bytecode::ByteCodeInstruction::GreaterOrEqual: return "GreaterOrEqual";
    case bytecode::ByteCodeInstruction::Not: return "Not";
    case bytecode::ByteCodeInstruction::Equal: return "Equal";
    case bytecode::ByteCodeInstruction::NotEqual: return "NotEqual";
    case bytecode::ByteCodeInstruction::And: return "And";
    case bytecode::ByteCodeInstruction::Or: return "Or";
    case bytecode::ByteCodeInstruction::GetType: return "GetType";
    case bytecode::ByteCodeInstruction::CastToInt: return "CastToInt";
    case bytecode::ByteCodeInstruction::CastToFloat: return "CastToFloat";
    case bytecode::ByteCodeInstruction::Length: return "Length";
    case bytecode::ByteCodeInstruction::ChatAt: return "ChatAt";
    case bytecode::ByteCodeInstruction::StringAppend: return "StringAppend";
    case bytecode::ByteCodeInstruction::ObjectGet: return "ObjectGet";
    case bytecode::ByteCodeInstruction::ObjectSet: return "ObjectSet";
    case bytecode::ByteCodeInstruction::GetEnv: return "GetEnv";
    case bytecode::ByteCodeInstruction::LoadClosure: return "LoadClosure" PARAM;
    case bytecode::ByteCodeInstruction::Pop: return "Pop";
    default: {
      if (panic) {
        this->panic("Unkown bytecode instruction encountered");
        return "";
      } else {
        return "<UNKNOWN>";
      }
    }
  }

  #undef PARAM
}